

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorsTests.cpp
# Opt level: O0

void __thiscall VectorsTest_Int3NotEquals_Test::TestBody(VectorsTest_Int3NotEquals_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  Int3 v2;
  Int3 v1;
  undefined8 in_stack_ffffffffffffff28;
  undefined1 success;
  String *in_stack_ffffffffffffff30;
  String *this_00;
  char *in_stack_ffffffffffffff40;
  Vector3<int> *this_01;
  int line;
  Vector3<int> *this_02;
  AssertionResult *this_03;
  Type type;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 uVar2;
  String local_98 [2];
  Message *in_stack_ffffffffffffff88;
  AssertHelper *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  uint uVar3;
  char *in_stack_ffffffffffffffa0;
  AssertionResult *in_stack_ffffffffffffffa8;
  AssertionResult local_30;
  Vector3<int> local_20;
  Vector3<int> local_14;
  
  success = (undefined1)((ulong)in_stack_ffffffffffffff28 >> 0x38);
  this_01 = &local_14;
  pica::Vector3<int>::Vector3(this_01,0xd,0x19,0x15);
  this_02 = &local_20;
  pica::Vector3<int>::Vector3(this_02,6,8,2);
  pica::operator!=(this_01,this_02);
  line = (int)((ulong)this_01 >> 0x20);
  this_03 = &local_30;
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)in_stack_ffffffffffffff30,(bool)success);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_03);
  type = (Type)((ulong)this_03 >> 0x20);
  uVar2 = bVar1;
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT17(bVar1,in_stack_ffffffffffffff60));
    testing::internal::GetBoolAssertionFailureMessage
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
               (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               (char *)in_stack_ffffffffffffff90);
    in_stack_ffffffffffffff40 = testing::internal::String::c_str((String *)&stack0xffffffffffffffa0)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_ffffffffffffff60),type,(char *)this_02,line,
               in_stack_ffffffffffffff40);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff30);
    testing::internal::String::~String(in_stack_ffffffffffffff30);
    testing::Message::~Message((Message *)0x1db846);
  }
  uVar3 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1db8ce);
  if (uVar3 == 0) {
    bVar1 = pica::operator!=(&local_14,&local_14);
    if (!bVar1) {
      pica::operator!=(&local_20,&local_20);
    }
    this_00 = (String *)&stack0xffffffffffffff88;
    testing::AssertionResult::AssertionResult((AssertionResult *)this_00,(bool)success);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)this_00);
    if (!bVar1) {
      testing::Message::Message((Message *)CONCAT17(uVar2,in_stack_ffffffffffffff60));
      testing::internal::GetBoolAssertionFailureMessage
                (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                 (char *)CONCAT44(uVar3,in_stack_ffffffffffffff98),(char *)in_stack_ffffffffffffff90
                );
      testing::internal::String::c_str(local_98);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(uVar2,in_stack_ffffffffffffff60),type,(char *)this_02,line
                 ,in_stack_ffffffffffffff40);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      testing::internal::String::~String(this_00);
      testing::Message::~Message((Message *)0x1dba05);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dba81);
  }
  return;
}

Assistant:

TEST(VectorsTest, Int3NotEquals)
{
    Int3 v1(13, 25, 21), v2(6, 8, 2);
    ASSERT_TRUE(v1 != v2);
    ASSERT_FALSE((v1 != v1) || (v2 != v2));
}